

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O1

bool __thiscall
MeteomaticsApiClient::readMultiPointTimeSeriesBin
          (MeteomaticsApiClient *this,MemoryClass *mem,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *results,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *times)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  int unaff_EBX;
  int32_t nParameter;
  int unaff_R12D;
  int iVar4;
  int iVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> tmpValues;
  double value;
  Matrix tmpMat;
  int local_a4;
  string local_98;
  double local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_50;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_48;
  MeteomaticsApiClient *local_40;
  double local_38;
  
  uVar1 = mem->readPos + 4;
  pcVar2 = (mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar1 <= (ulong)((long)(mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pcVar2)) {
    unaff_R12D = *(int *)(pcVar2 + mem->readPos);
    mem->readPos = uVar1;
  }
  if (0 < unaff_R12D) {
    iVar6 = 0;
    local_50 = results;
    local_48 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)times;
    local_40 = this;
    do {
      uVar1 = mem->readPos + 4;
      pcVar2 = (mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar1 <= (ulong)((long)(mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pcVar2)) {
        local_a4 = *(int *)(pcVar2 + mem->readPos);
        mem->readPos = uVar1;
      }
      local_68.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::reserve(&local_68,(long)local_a4);
      if (0 < local_a4) {
        iVar4 = 0;
        do {
          uVar1 = mem->readPos + 4;
          pcVar2 = (mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar3 = (long)(mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pcVar2;
          if (uVar1 <= uVar3) {
            unaff_EBX = *(int *)(pcVar2 + mem->readPos);
            mem->readPos = uVar1;
          }
          uVar1 = mem->readPos + 8;
          if (uVar1 <= uVar3) {
            local_38 = *(double *)(pcVar2 + mem->readPos);
            mem->readPos = uVar1;
          }
          convDateIso8601_abi_cxx11_(&local_98,local_40,local_38);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_48,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          local_98._M_dataplus._M_p = (pointer)0x0;
          local_98._M_string_length = 0;
          local_98.field_2._M_allocated_capacity = 0;
          std::vector<double,_std::allocator<double>_>::reserve
                    ((vector<double,_std::allocator<double>_> *)&local_98,(long)unaff_EBX);
          iVar5 = unaff_EBX;
          if (0 < unaff_EBX) {
            do {
              uVar1 = mem->readPos + 8;
              pcVar2 = (mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (uVar1 <= (ulong)((long)(mem->mem).super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_finish - (long)pcVar2))
              {
                local_70 = *(double *)(pcVar2 + mem->readPos);
                mem->readPos = uVar1;
              }
              if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&local_98,
                           (iterator)local_98._M_string_length,&local_70);
              }
              else {
                *(double *)local_98._M_string_length = local_70;
                local_98._M_string_length = local_98._M_string_length + 8;
              }
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&local_68,(value_type *)&local_98);
          if (local_98._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 != local_a4);
      }
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::push_back(local_50,&local_68);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_68);
      iVar6 = iVar6 + 1;
    } while (iVar6 != unaff_R12D);
  }
  return true;
}

Assistant:

bool MeteomaticsApiClient::readMultiPointTimeSeriesBin(MMIntern::MemoryClass& mem, std::vector<Matrix>& results, std::vector<std::string>& times) const
{
    int32_t nCoords;
    mem.read(nCoords);
    
    for (int32_t i=0; i<nCoords; i++)
    {
        int32_t nTimes;
        mem.read(nTimes);
        
        Matrix tmpMat;
        tmpMat.reserve(nTimes);
        for (int32_t j=0; j<nTimes; j++)
        {
            int32_t nParameter;
            mem.read(nParameter);
            
            double t;
            mem.read(t);
            times.push_back(convDateIso8601(t));
            
            std::vector<double> tmpValues;
            tmpValues.reserve(nParameter);
            for (int32_t k=0; k<nParameter; k++)
            {
                double value;
                mem.read(value);
                tmpValues.push_back(value);
            }
            tmpMat.push_back(tmpValues);
        }
        results.push_back(tmpMat);
    }
    
    return true;
}